

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_set_type_from_names(nifti_image *nim)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *__format;
  
  if (nim == (nifti_image *)0x0) {
    nifti_set_type_from_names_cold_2();
    return -1;
  }
  pcVar2 = nim->fname;
  pcVar3 = nim->iname;
  if (pcVar2 != (char *)0x0) {
    if (pcVar3 != (char *)0x0) {
      iVar1 = nifti_validfilename(pcVar2);
      if ((((iVar1 != 0) && (iVar1 = nifti_validfilename(nim->iname), iVar1 != 0)) &&
          (pcVar2 = nifti_find_file_extension(nim->fname), pcVar2 != (char *)0x0)) &&
         (pcVar2 = nifti_find_file_extension(nim->iname), pcVar2 != (char *)0x0)) {
        if (2 < g_opts_0) {
          nifti_set_type_from_names_cold_1();
        }
        pcVar2 = nifti_find_file_extension(nim->fname);
        iVar1 = fileext_compare(pcVar2,".nia");
        if (iVar1 == 0) {
          nim->nifti_type = 3;
          uVar4 = 3;
        }
        else {
          iVar1 = strcmp(nim->fname,nim->iname);
          if (iVar1 == 0) {
            nim->nifti_type = 1;
            uVar4 = 1;
          }
          else {
            uVar4 = (ulong)(uint)nim->nifti_type;
            if (nim->nifti_type == 1) {
              nim->nifti_type = 2;
              uVar4 = 2;
            }
          }
        }
        if (2 < g_opts_0) {
          fprintf(_stderr," -> %d\n",uVar4);
        }
        if (1 < g_opts_0) {
          nifti_type_and_names_match(nim,1);
        }
        if (3 < (uint)nim->nifti_type) {
          fprintf(_stderr,"** NSTFN: bad nifti_type %d, for \'%s\' and \'%s\'\n",
                  (ulong)(uint)nim->nifti_type,nim->fname,nim->iname);
          return -1;
        }
        return 0;
      }
      pcVar2 = nim->fname;
      pcVar3 = nim->iname;
      __format = "** NSTFN: invalid filename(s) fname=\'%s\', iname=\'%s\'\n";
      goto LAB_0010adb4;
    }
    pcVar3 = (char *)0x0;
  }
  __format = "** NSTFN: missing filename(s) fname @ %p, iname @ %p\n";
LAB_0010adb4:
  fprintf(_stderr,__format,pcVar2,pcVar3);
  return -1;
}

Assistant:

int nifti_set_type_from_names( nifti_image * nim )
{
   /* error checking first */
   if( !nim ){ fprintf(stderr,"** NSTFN: no nifti_image\n");  return -1; }

   if( !nim->fname || !nim->iname ){
      fprintf(stderr,"** NSTFN: missing filename(s) fname @ %p, iname @ %p\n",
              nim->fname, nim->iname);
      return -1;
   }

   if( ! nifti_validfilename      ( nim->fname ) ||
       ! nifti_validfilename      ( nim->iname ) ||
       ! nifti_find_file_extension( nim->fname ) ||
       ! nifti_find_file_extension( nim->iname )
     ) {
      fprintf(stderr,"** NSTFN: invalid filename(s) fname='%s', iname='%s'\n",
              nim->fname, nim->iname);
      return -1;
   }

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d verify nifti_type from filenames: %d",nim->nifti_type);

   /* type should be NIFTI_FTYPE_ASCII if extension is .nia */
   if( (fileext_compare(nifti_find_file_extension(nim->fname),".nia")==0)){
      nim->nifti_type = NIFTI_FTYPE_ASCII;
   } else {
      /* not too picky here, do what must be done, and then verify */
      if( strcmp(nim->fname, nim->iname) == 0 )          /* one file, type 1 */
         nim->nifti_type = NIFTI_FTYPE_NIFTI1_1;
      else if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ) /* cannot be type 1 */
         nim->nifti_type = NIFTI_FTYPE_NIFTI1_2;
   }

   if( g_opts.debug > 2 ) fprintf(stderr," -> %d\n",nim->nifti_type);

   if( g_opts.debug > 1 )  /* warn user about anything strange */
      nifti_type_and_names_match(nim, 1);

   if( is_valid_nifti_type(nim->nifti_type) ) return 0;  /* success! */

   fprintf(stderr,"** NSTFN: bad nifti_type %d, for '%s' and '%s'\n",
           nim->nifti_type, nim->fname, nim->iname);

   return -1;
}